

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O3

shared_ptr<mocker::nasm::MemoryAddr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::buildMemAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Reg> *addr)

{
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<mocker::nasm::MemoryAddr> sVar3;
  undefined1 local_29 [9];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  if (in_RCX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      in_RCX->_M_use_count = in_RCX->_M_use_count + 1;
      UNLOCK();
    }
    else {
      in_RCX->_M_use_count = in_RCX->_M_use_count + 1;
    }
  }
  local_20 = in_RCX;
  getIrAddr((FuncSelectionContext *)&stack0xffffffffffffffe8,(shared_ptr<mocker::ir::Addr> *)addr);
  (this->irRegAddr).mp._M_h._M_buckets = (__buckets_ptr)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Addr>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->irRegAddr).mp._M_h._M_bucket_count,(MemoryAddr **)this,
             (allocator<mocker::nasm::MemoryAddr> *)local_29,
             (shared_ptr<mocker::nasm::Addr> *)&stack0xffffffffffffffe8);
  peVar1 = extraout_RAX;
  _Var2._M_pi = extraout_RDX;
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
    peVar1 = extraout_RAX_00;
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    peVar1 = extraout_RAX_01;
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (shared_ptr<mocker::nasm::MemoryAddr>)
         sVar3.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::MemoryAddr>
  buildMemAddr(const std::shared_ptr<ir::Reg> &addr) const {
    // TODO
    return std::make_shared<nasm::MemoryAddr>(getIrAddr(addr));
  }